

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase693::run(TestCase693 *this)

{
  StructDataBitCount *this_00;
  bool bVar1;
  Builder *params;
  Builder *extraout_RDX;
  Builder *params_00;
  Builder *extraout_RDX_00;
  String local_1e8;
  bool local_1c9;
  undefined1 local_1c8 [7];
  bool _kj_shouldLog;
  char (*local_1b0) [33];
  undefined1 local_1a8 [8];
  DebugComparison<const_char_(&)[33],_kj::String> _kjCondition;
  BuilderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> l;
  undefined1 local_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase693 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::
  initRoot<capnproto_test::capnp::test::TestGenerics<capnp::Text,capnp::List<unsigned_int,(capnp::Kind)0>>::Inner>
            ((Builder *)local_128,(MessageBuilder *)this_00);
  Text::Reader::Reader((Reader *)&l.builder.structDataSize,"abcd");
  capnproto_test::capnp::test::TestGenerics<capnp::Text,_capnp::List<unsigned_int,_(capnp::Kind)0>_>
  ::Inner::Builder::setFoo((Builder *)local_128,(ReaderFor<capnp::Text>)stack0xfffffffffffffeb8);
  capnproto_test::capnp::test::TestGenerics<capnp::Text,_capnp::List<unsigned_int,_(capnp::Kind)0>_>
  ::Inner::Builder::initBar
            ((BuilderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)&_kjCondition.result,
             (Builder *)local_128,2);
  List<unsigned_int,_(capnp::Kind)0>::Builder::set((Builder *)&_kjCondition.result,0,0x7b);
  List<unsigned_int,_(capnp::Kind)0>::Builder::set((Builder *)&_kjCondition.result,1,0x1c8);
  local_1b0 = (char (*) [33])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                         (char (*) [33])"(foo = \"abcd\", bar = [123, 456])");
  kj::
  str<capnproto_test::capnp::test::TestGenerics<capnp::Text,capnp::List<unsigned_int,(capnp::Kind)0>>::Inner::Builder&>
            ((String *)local_1c8,(kj *)local_128,params);
  kj::_::DebugExpression<char_const(&)[33]>::operator==
            ((DebugComparison<const_char_(&)[33],_kj::String> *)local_1a8,
             (DebugExpression<char_const(&)[33]> *)&local_1b0,(String *)local_1c8);
  kj::String::~String((String *)local_1c8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1a8);
  if (!bVar1) {
    local_1c9 = kj::_::Debug::shouldLog(ERROR);
    params_00 = extraout_RDX;
    while (local_1c9 != false) {
      kj::
      str<capnproto_test::capnp::test::TestGenerics<capnp::Text,capnp::List<unsigned_int,(capnp::Kind)0>>::Inner::Builder&>
                (&local_1e8,(kj *)local_128,params_00);
      kj::_::Debug::
      log<char_const(&)[75],kj::_::DebugComparison<char_const(&)[33],kj::String>&,char_const(&)[33],kj::String>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
                 ,0x2bd,ERROR,
                 "\"failed: expected \" \"(\\\"(foo = \\\\\\\"abcd\\\\\\\", bar = [123, 456])\\\") == (kj::str(root))\", _kjCondition, \"(foo = \\\"abcd\\\", bar = [123, 456])\", kj::str(root)"
                 ,(char (*) [75])
                  "failed: expected (\"(foo = \\\"abcd\\\", bar = [123, 456])\") == (kj::str(root))"
                 ,(DebugComparison<const_char_(&)[33],_kj::String> *)local_1a8,
                 (char (*) [33])"(foo = \"abcd\", bar = [123, 456])",&local_1e8);
      kj::String::~String(&local_1e8);
      params_00 = extraout_RDX_00;
      local_1c9 = false;
    }
  }
  kj::_::DebugComparison<const_char_(&)[33],_kj::String>::~DebugComparison
            ((DebugComparison<const_char_(&)[33],_kj::String> *)local_1a8);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  return;
}

Assistant:

TEST(Stringify, Generics) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<test::TestGenerics<Text, List<uint32_t>>::Inner>();
  root.setFoo("abcd");
  auto l = root.initBar(2);
  l.set(0, 123);
  l.set(1, 456);

  EXPECT_EQ("(foo = \"abcd\", bar = [123, 456])", kj::str(root));
}